

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O2

void av1_find_mv_refs(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mi,MV_REFERENCE_FRAME ref_frame,
                     uint8_t *ref_mv_count,CANDIDATE_MV (*ref_mv_stack) [8],
                     uint16_t (*ref_mv_weight) [8],int_mv (*mv_ref_list) [2],int_mv *global_mvs,
                     int16_t *mode_context)

{
  short *psVar1;
  undefined1 auVar2 [16];
  BLOCK_SIZE bsize;
  char cVar3;
  MB_MODE_INFO *pMVar4;
  MV_REFERENCE_FRAME MVar5;
  ushort uVar6;
  int idx_9;
  int_mv iVar7;
  int iVar8;
  int iVar9;
  int (*paiVar10) [2];
  uint uVar14;
  undefined7 in_register_00000009;
  long lVar11;
  int_mv *piVar12;
  byte bVar13;
  uint uVar15;
  int_mv (*paiVar16) [2];
  int row;
  uint uVar17;
  CANDIDATE_MV *pCVar18;
  int blk_row;
  uint uVar19;
  CANDIDATE_MV *pCVar20;
  uint uVar22;
  ulong uVar21;
  int_mv *piVar23;
  MV_REFERENCE_FRAME MVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  int list_idx_1;
  long lVar29;
  int i;
  int blk_col;
  uint blk_col_00;
  int iVar30;
  uint uVar31;
  int idx_1;
  MACROBLOCKD *pMVar32;
  bool bVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined7 uStack_158;
  uint8_t row_match_count;
  uint8_t newmv_count;
  uint8_t col_match_count;
  MV_REFERENCE_FRAME rf [2];
  byte local_14c;
  uint8_t dummy_newmv_count;
  MACROBLOCKD *local_140;
  CANDIDATE_MV *local_138;
  int_mv *local_130;
  int_mv gm_mv [2];
  int_mv local_10c;
  int processed_cols;
  int processed_rows;
  long local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  int ref_diff_count [2];
  int ref_id_count [2];
  byte local_cc;
  int tpl_sample_pos [3] [2];
  int_mv local_98 [6];
  ulong local_80;
  long local_78;
  CANDIDATE_MV (*local_70) [8];
  ulong local_68;
  ulong local_60;
  ulong local_58;
  int_mv (*local_50) [2];
  int_mv ref_diff [2] [2];
  
  uVar31 = xd->mi_row;
  uVar15 = xd->mi_col;
  lVar11 = (long)ref_frame;
  local_e8 = (ulong)(byte)ref_frame;
  local_138 = (CANDIDATE_MV *)
              CONCAT44(local_138._4_4_,(int)CONCAT71(in_register_00000009,ref_frame));
  local_140 = xd;
  local_130 = (int_mv *)ref_mv_count;
  local_100 = lVar11;
  local_70 = ref_mv_stack;
  if (ref_frame == '\0') {
    gm_mv[0] = (int_mv)0x0;
    gm_mv[1] = (int_mv)0x0;
    local_10c.as_int = 0;
    MVar5 = '\0';
    if (global_mvs != (int_mv *)0x0) {
      global_mvs->as_int = 0x80008000;
    }
  }
  else {
    uVar25 = (uint)(cm->features).allow_high_precision_mv;
    bVar33 = (cm->features).cur_frame_force_integer_mv;
    bsize = mi->bsize;
    if (ref_frame < '\b') {
      local_10c = gm_get_motion_vector
                            (cm->global_motion + lVar11,uVar25,bsize,uVar15,uVar31,(uint)bVar33);
      gm_mv[1].as_int = 0;
      gm_mv[0].as_int = local_10c.as_int;
      if (global_mvs != (int_mv *)0x0) {
        global_mvs[lVar11] = local_10c;
      }
    }
    else {
      cVar3 = ref_frame_map[(byte)ref_frame - 8][1];
      local_10c = gm_get_motion_vector
                            (cm->global_motion + ref_frame_map[(byte)ref_frame - 8][0],uVar25,bsize,
                             uVar15,uVar31,(uint)bVar33);
      ref_mv_stack = local_70;
      gm_mv[0].as_int = local_10c.as_int;
      iVar7 = gm_get_motion_vector
                        (cm->global_motion + cVar3,uVar25,bsize,uVar15,uVar31,(uint)bVar33);
      gm_mv[1].as_int = iVar7.as_int;
      lVar11 = local_100;
    }
    MVar5 = (MV_REFERENCE_FRAME)local_138;
  }
  pMVar32 = local_140;
  local_130 = (int_mv *)((long)local_130 + lVar11);
  local_50 = mv_ref_list + lVar11;
  if (mv_ref_list == (int_mv (*) [2])0x0) {
    local_50 = (int_mv (*) [2])0x0;
  }
  uVar25._0_1_ = local_140->width;
  uVar25._1_1_ = local_140->height;
  uVar25._2_2_ = *(undefined2 *)&local_140->field_0x2076;
  bVar13 = local_140->height;
  uVar22 = (uint)bVar13;
  if (bVar13 < (byte)(undefined1)uVar25) {
    uVar22 = uVar25;
  }
  iVar8 = has_top_right(cm,local_140,uVar31,uVar15,uVar22 & 0xff);
  bVar13 = bVar13 < 2 & (byte)uVar31;
  processed_rows = 0;
  processed_cols = 0;
  MVar24 = -1;
  if ('\a' < MVar5) {
    uVar22 = (int)local_e8 - 8;
    MVar5 = ref_frame_map[uVar22][0];
    MVar24 = ref_frame_map[uVar22][1];
  }
  local_14c = (byte)uVar15;
  local_14c = (byte)(undefined1)uVar25 < 2 & local_14c;
  local_60 = (ulong)bVar13;
  mode_context[local_100] = 0;
  *(uint8_t *)local_130 = '\0';
  local_f8 = 0;
  uVar26 = 0;
  if (pMVar32->up_available == true) {
    uVar22 = (bVar13 - 6) + (uint)(pMVar32->height < 2) * 2;
    uVar25 = ~uVar31 + (pMVar32->tile).mi_row_end;
    uVar14 = (pMVar32->tile).mi_row_start - uVar31;
    if ((int)uVar22 < (int)uVar25) {
      uVar25 = uVar22;
    }
    uVar26 = (ulong)uVar25;
    if ((int)uVar22 < (int)uVar14) {
      uVar26 = (ulong)uVar14;
    }
  }
  local_68 = (ulong)local_14c;
  if (pMVar32->left_available == true) {
    uVar22 = (local_14c - 6) + (uint)(pMVar32->width < 2) * 2;
    uVar25 = ~uVar15 + (pMVar32->tile).mi_col_end;
    uVar14 = (pMVar32->tile).mi_col_start - uVar15;
    if ((int)uVar22 < (int)uVar25) {
      uVar25 = uVar22;
    }
    if ((int)uVar22 < (int)uVar14) {
      uVar25 = uVar14;
    }
    local_f8 = (ulong)uVar25;
  }
  local_78 = local_100 * 0x40;
  pCVar20 = ref_mv_stack[local_100];
  pCVar18 = (CANDIDATE_MV *)(ref_mv_weight + local_100);
  col_match_count = '\0';
  row_match_count = '\0';
  newmv_count = '\0';
  iVar30 = (int)uVar26;
  iVar9 = -iVar30;
  if (0 < iVar30) {
    iVar9 = iVar30;
  }
  local_e8 = CONCAT44(local_e8._4_4_,iVar9);
  rf[0] = MVar5;
  rf[1] = MVar24;
  if (iVar30 != 0) {
    scan_row_mbmi(cm,pMVar32,uVar15,rf,-1,pCVar20,(uint16_t *)pCVar18,(uint8_t *)&local_130->as_int,
                  &row_match_count,&newmv_count,gm_mv,iVar30,&processed_rows);
  }
  uVar22 = (uint)local_f8;
  uVar25 = -uVar22;
  if (0 < (int)uVar22) {
    uVar25 = uVar22;
  }
  local_f0 = uVar26;
  if (uVar22 != 0) {
    scan_col_mbmi(cm,pMVar32,uVar31,rf,-1,pCVar20,(uint16_t *)pCVar18,(uint8_t *)&local_130->as_int,
                  &col_match_count,&newmv_count,gm_mv,uVar22,&processed_cols);
  }
  piVar12 = local_130;
  if (iVar8 != 0) {
    scan_blk_mbmi(cm,pMVar32,uVar31,uVar15,rf,(uint)pMVar32->width,(int)pCVar20,pCVar18,
                  (uint16_t *)&row_match_count,&newmv_count,(uint8_t *)&gm_mv[0].as_int,local_130,
                  (uint8_t *)CONCAT17(row_match_count,uStack_158));
  }
  bVar13 = *(byte *)piVar12;
  for (uVar26 = 0; bVar13 != uVar26; uVar26 = uVar26 + 1) {
    psVar1 = (short *)((long)&pCVar18->this_mv + uVar26 * 2);
    *psVar1 = *psVar1 + 0x280;
  }
  local_80 = (ulong)bVar13;
  bVar33 = row_match_count == '\0';
  uVar22 = (col_match_count != '\0') + 1;
  MVar5 = (MV_REFERENCE_FRAME)local_138;
  local_138 = pCVar20;
  if ((cm->features).allow_ref_frame_mvs != false) {
    bVar13 = pMVar32->height;
    tpl_sample_pos[0][0] = 2;
    if (2 < bVar13) {
      tpl_sample_pos[0][0] = (int)bVar13;
    }
    uVar14._0_1_ = pMVar32->width;
    uVar14._1_1_ = pMVar32->height;
    uVar14._2_2_ = *(undefined2 *)&pMVar32->field_0x2076;
    uVar19 = 2;
    if (2 < (byte)(undefined1)uVar14) {
      uVar19 = uVar14;
    }
    uVar17 = uVar14;
    if (0xf < (byte)(undefined1)uVar14) {
      uVar17 = 0x10;
    }
    local_58 = (ulong)bVar13;
    uVar28 = (uint)bVar13;
    if (0xf < bVar13) {
      uVar28 = 0x10;
    }
    local_cc = (undefined1)uVar14 - 2;
    tpl_sample_pos[0][1] = -2;
    tpl_sample_pos[1][0] = tpl_sample_pos[0][0];
    tpl_sample_pos[1][1] = uVar19 & 0xff;
    tpl_sample_pos[2][0] = tpl_sample_pos[0][0] - 2;
    tpl_sample_pos[2][1] = uVar19 & 0xff;
    iVar8 = 0;
    for (uVar19 = 0; pCVar20 = local_138, uVar19 < uVar28;
        uVar19 = uVar19 + (uint)(0xf < bVar13) * 2 + 2) {
      for (blk_col_00 = 0; blk_col_00 < (uVar17 & 0xff);
          blk_col_00 = blk_col_00 + (uint)(0xf < (byte)(undefined1)uVar14) * 2 + 2) {
        iVar9 = add_tpl_ref_mv(cm,local_140,uVar31,uVar15,MVar5,uVar19,blk_col_00,gm_mv,
                               (uint8_t *)&local_130->as_int,local_138,(uint16_t *)pCVar18,
                               mode_context);
        if (blk_col_00 == 0 && uVar19 == 0) {
          iVar8 = iVar9;
        }
      }
    }
    if (iVar8 == 0) {
      *(byte *)(mode_context + local_100) = *(byte *)(mode_context + local_100) | 8;
    }
    pMVar32 = local_140;
    if ((byte)((char)local_58 - 2U) < 0xe && local_cc < 0xe) {
      for (lVar11 = 0; pMVar32 = local_140, lVar11 != 3; lVar11 = lVar11 + 1) {
        if ((tpl_sample_pos[lVar11][0] + (uVar31 & 0xf) < 0x10) &&
           (tpl_sample_pos[lVar11][1] + (uVar15 & 0xf) < 0x10)) {
          add_tpl_ref_mv(cm,local_140,uVar31,uVar15,MVar5,tpl_sample_pos[lVar11][0],
                         tpl_sample_pos[lVar11][1],gm_mv,(uint8_t *)&local_130->as_int,pCVar20,
                         (uint16_t *)pCVar18,mode_context);
        }
      }
    }
  }
  dummy_newmv_count = '\0';
  scan_blk_mbmi(cm,pMVar32,uVar31,uVar15,rf,-1,(int)pCVar20,pCVar18,(uint16_t *)&row_match_count,
                &dummy_newmv_count,(uint8_t *)&gm_mv[0].as_int,local_130,
                (uint8_t *)CONCAT17(row_match_count,uStack_158));
  uVar14 = (uint)local_68;
  iVar30 = uVar14 - 3;
  uVar19 = (uint)local_60;
  iVar9 = uVar19 - 3;
  for (iVar8 = 0; piVar12 = local_130, iVar8 != 4; iVar8 = iVar8 + 2) {
    uVar17 = (uVar19 ^ 3) + iVar8;
    if ((uVar17 <= (uint)local_e8) && (processed_rows < (int)uVar17)) {
      scan_row_mbmi(cm,local_140,uVar15,rf,iVar9,local_138,(uint16_t *)pCVar18,
                    (uint8_t *)&local_130->as_int,&row_match_count,&dummy_newmv_count,gm_mv,
                    (int)local_f0,&processed_rows);
    }
    uVar17 = (uVar14 ^ 3) + iVar8;
    if ((uVar17 <= uVar25) && (processed_cols < (int)uVar17)) {
      scan_col_mbmi(cm,local_140,uVar31,rf,iVar30,local_138,(uint16_t *)pCVar18,
                    (uint8_t *)&local_130->as_int,&col_match_count,&dummy_newmv_count,gm_mv,
                    (int)local_f8,&processed_cols);
    }
    iVar30 = iVar30 + -2;
    iVar9 = iVar9 + -2;
  }
  if (uVar22 == bVar33) {
    if (col_match_count != '\0' || row_match_count != '\0') {
      *(byte *)(mode_context + local_100) = *(byte *)(mode_context + local_100) | 1;
    }
    if ((row_match_count != '\0') == (col_match_count != '\0')) {
      if (row_match_count == '\0' || col_match_count == '\0') goto LAB_00335728;
      uVar6 = mode_context[local_100] | 0x20;
    }
    else {
      uVar6 = mode_context[local_100] | 0x10;
    }
  }
  else if (uVar22 - bVar33 == 1) {
    uVar6 = (ushort)(newmv_count == '\0') | mode_context[local_100];
    mode_context[local_100] = uVar6 | 2;
    if ((row_match_count != '\0') == (col_match_count != '\0')) {
      if (row_match_count == '\0' || col_match_count == '\0') goto LAB_00335728;
      uVar6 = uVar6 | 0x42;
    }
    else {
      uVar6 = uVar6 | 0x32;
    }
  }
  else {
    uVar6 = (ushort)(newmv_count == '\0') | mode_context[local_100] | 0x54;
  }
  mode_context[local_100] = uVar6;
LAB_00335728:
  uVar26 = local_80 & 0xffffffff;
  while (uVar27 = uVar26, 0 < (int)uVar27) {
    uVar26 = 0;
    for (uVar21 = 1; uVar27 != uVar21; uVar21 = uVar21 + 1) {
      uVar6 = *(ushort *)((long)pCVar18 + uVar21 * 2 + -2);
      if (uVar6 < *(ushort *)((long)&pCVar18->this_mv + uVar21 * 2)) {
        auVar2 = *(undefined1 (*) [16])(local_138 + (uVar21 - 1));
        auVar34._0_8_ = auVar2._8_8_;
        auVar34._8_4_ = auVar2._0_4_;
        auVar34._12_4_ = auVar2._4_4_;
        *(undefined1 (*) [16])(local_138 + (uVar21 - 1)) = auVar34;
        *(undefined2 *)((long)pCVar18 + uVar21 * 2 + -2) =
             *(undefined2 *)((long)&pCVar18->this_mv + uVar21 * 2);
        *(ushort *)((long)&pCVar18->this_mv + uVar21 * 2) = uVar6;
        uVar26 = uVar21 & 0xffffffff;
      }
    }
  }
  uVar25 = (uint)*(byte *)local_130;
  while ((int)(uint)local_80 < (int)uVar25) {
    lVar11 = (long)(int)uVar25;
    uVar26 = local_80;
    uVar25 = (uint)local_80;
    while (uVar27 = uVar26, uVar26 = uVar27 + 1, (long)uVar26 < lVar11) {
      uVar6 = *(ushort *)((long)&pCVar18->this_mv + uVar27 * 2);
      if (uVar6 < *(ushort *)((long)&pCVar18->this_mv + uVar27 * 2 + 2)) {
        auVar2 = *(undefined1 (*) [16])((long)&(*local_70)[uVar27].this_mv + local_78);
        auVar35._0_8_ = auVar2._8_8_;
        auVar35._8_4_ = auVar2._0_4_;
        auVar35._12_4_ = auVar2._4_4_;
        *(undefined1 (*) [16])((long)&(*local_70)[uVar27].this_mv + local_78) = auVar35;
        *(undefined2 *)((long)&pCVar18->this_mv + uVar27 * 2) =
             *(undefined2 *)((long)&pCVar18->this_mv + uVar27 * 2 + 2);
        *(ushort *)((long)&pCVar18->this_mv + uVar27 * 2 + 2) = uVar6;
        uVar25 = (uint)uVar26;
      }
    }
  }
  uVar22._0_1_ = local_140->width;
  uVar22._1_1_ = local_140->height;
  uVar22._2_2_ = *(undefined2 *)&local_140->field_0x2076;
  if (0xf < (byte)(undefined1)uVar22) {
    uVar22 = 0x10;
  }
  uVar15 = (cm->mi_params).mi_cols - uVar15;
  if ((int)(uVar22 & 0xff) <= (int)uVar15) {
    uVar15 = uVar22 & 0xff;
  }
  uVar25 = 0x10;
  if (local_140->height < 0x10) {
    uVar25 = (uint)local_140->height;
  }
  uVar31 = (cm->mi_params).mi_rows - uVar31;
  if ((int)uVar25 <= (int)uVar31) {
    uVar31 = uVar25;
  }
  if ((int)uVar15 < (int)uVar31) {
    uVar31 = uVar15;
  }
  if (MVar24 < '\0') {
    if ((int)local_f0 != 0) {
      iVar8 = 0;
      while ((iVar8 < (int)uVar31 && (*(byte *)piVar12 < 2))) {
        pMVar4 = local_140->mi[iVar8 - local_140->mi_stride];
        process_single_ref_mv_candidate
                  (pMVar4,cm,MVar5,(uint8_t *)&piVar12->as_int,local_138,(uint16_t *)pCVar18);
        iVar8 = iVar8 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [pMVar4->bsize];
      }
    }
    if ((int)local_f8 != 0) {
      iVar8 = 0;
      while ((iVar8 < (int)uVar31 && (*(byte *)piVar12 < 2))) {
        pMVar4 = local_140->mi[(long)iVar8 * (long)local_140->mi_stride + -1];
        process_single_ref_mv_candidate
                  (pMVar4,cm,MVar5,(uint8_t *)&piVar12->as_int,local_138,(uint16_t *)pCVar18);
        iVar8 = iVar8 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                              [pMVar4->bsize];
      }
    }
    pCVar20 = local_138;
    pMVar32 = local_140;
    pCVar18 = local_138;
    for (uVar26 = 0; uVar27 = (ulong)*(byte *)piVar12, uVar26 < uVar27; uVar26 = uVar26 + 1) {
      clamp_mv_ref((MV *)pCVar18,(uint)pMVar32->width << 2,(uint)pMVar32->height << 2,pMVar32);
      pCVar18 = pCVar18 + 1;
    }
    if (local_50 != (int_mv (*) [2])0x0) {
      for (; uVar27 < 2; uVar27 = uVar27 + 1) {
        (*local_50)[uVar27] = local_10c;
      }
      uVar26 = 0;
      while( true ) {
        bVar13 = *(byte *)piVar12;
        if (1 < bVar13) {
          bVar13 = 2;
        }
        if (bVar13 <= uVar26) break;
        (*local_50)[uVar26] = pCVar20[uVar26].this_mv;
        uVar26 = uVar26 + 1;
      }
    }
  }
  else {
    uVar26 = (ulong)*(byte *)local_130;
    if (*(byte *)local_130 < 2) {
      ref_id_count[0] = 0;
      ref_id_count[1] = 0;
      ref_diff_count[0] = 0;
      ref_diff_count[1] = 0;
      if ((int)local_f0 != 0) {
        for (iVar8 = 0; iVar8 < (int)uVar31;
            iVar8 = iVar8 + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                  [pMVar4->bsize]) {
          pMVar4 = local_140->mi[iVar8 - local_140->mi_stride];
          process_compound_ref_mv_candidate
                    (pMVar4,cm,rf,(int_mv (*) [2])tpl_sample_pos,ref_id_count,ref_diff,
                     ref_diff_count);
        }
      }
      if ((int)local_f8 != 0) {
        for (iVar8 = 0; iVar8 < (int)uVar31;
            iVar8 = iVar8 + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                  [pMVar4->bsize]) {
          pMVar4 = local_140->mi[(long)iVar8 * (long)local_140->mi_stride + -1];
          process_compound_ref_mv_candidate
                    (pMVar4,cm,rf,(int_mv (*) [2])tpl_sample_pos,ref_id_count,ref_diff,
                     ref_diff_count);
        }
      }
      paiVar10 = tpl_sample_pos;
      piVar12 = local_98;
      paiVar16 = ref_diff;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        iVar8 = ref_id_count[lVar11];
        piVar23 = piVar12;
        for (uVar26 = 0; ((long)uVar26 < (long)iVar8 && (uVar26 < 2)); uVar26 = uVar26 + 1) {
          piVar12[uVar26 * 2] = *(int_mv *)(*paiVar10 + uVar26);
          piVar23 = piVar23 + 2;
        }
        iVar8 = ref_diff_count[lVar11];
        for (lVar29 = 0; (uVar27 = uVar26 + lVar29, lVar29 < iVar8 && (uVar27 < 2));
            lVar29 = lVar29 + 1) {
          *piVar23 = (*paiVar16)[lVar29];
          piVar23 = piVar23 + 2;
        }
        for (; uVar27 < 2; uVar27 = uVar27 + 1) {
          *piVar23 = gm_mv[lVar11];
          piVar23 = piVar23 + 2;
        }
        paiVar10 = paiVar10 + 1;
        piVar12 = piVar12 + 1;
        paiVar16 = paiVar16 + 1;
      }
      uVar26 = (ulong)*(byte *)local_130;
      if (uVar26 == 0) {
        uVar26 = 0;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          local_138[uVar26].this_mv = local_98[lVar11 * 2];
          local_138[*(byte *)local_130].comp_mv = local_98[lVar11 * 2 + 1];
          *(undefined2 *)((long)&pCVar18->this_mv + (ulong)*(byte *)local_130 * 2) = 2;
          uVar26 = (ulong)(byte)(*(byte *)local_130 + 1);
          *(byte *)local_130 = *(byte *)local_130 + 1;
        }
      }
      else {
        if ((local_98[0].as_int == (local_138->this_mv).as_int) &&
           (local_98[1].as_int == (local_138->comp_mv).as_int)) {
          local_138[uVar26].this_mv = local_98[2];
          bVar13 = *(byte *)local_130;
        }
        else {
          local_138[uVar26].this_mv.as_int = (uint32_t)local_98[0];
          bVar13 = *(byte *)local_130;
          local_98[3] = local_98[1];
        }
        local_138[bVar13].comp_mv = local_98[3];
        *(undefined2 *)((long)&pCVar18->this_mv + (ulong)*(byte *)local_130 * 2) = 2;
        uVar26 = (ulong)(byte)(*(byte *)local_130 + 1);
        *(byte *)local_130 = *(byte *)local_130 + 1;
      }
    }
    piVar12 = local_130;
    pMVar32 = local_140;
    pCVar20 = local_138;
    for (uVar27 = 0; uVar27 < uVar26; uVar27 = uVar27 + 1) {
      clamp_mv_ref((MV *)pCVar20,(uint)pMVar32->width << 2,(uint)pMVar32->height << 2,pMVar32);
      clamp_mv_ref(&(pCVar20->comp_mv).as_mv,(uint)pMVar32->width << 2,(uint)pMVar32->height << 2,
                   pMVar32);
      uVar26 = (ulong)*(byte *)piVar12;
      pCVar20 = pCVar20 + 1;
    }
  }
  return;
}

Assistant:

void av1_find_mv_refs(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                      MB_MODE_INFO *mi, MV_REFERENCE_FRAME ref_frame,
                      uint8_t ref_mv_count[MODE_CTX_REF_FRAMES],
                      CANDIDATE_MV ref_mv_stack[][MAX_REF_MV_STACK_SIZE],
                      uint16_t ref_mv_weight[][MAX_REF_MV_STACK_SIZE],
                      int_mv mv_ref_list[][MAX_MV_REF_CANDIDATES],
                      int_mv *global_mvs, int16_t *mode_context) {
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  int_mv gm_mv[2];

  if (ref_frame == INTRA_FRAME) {
    gm_mv[0].as_int = gm_mv[1].as_int = 0;
    if (global_mvs != NULL) {
      global_mvs[ref_frame].as_int = INVALID_MV;
    }
  } else {
    const BLOCK_SIZE bsize = mi->bsize;
    const int allow_high_precision_mv = cm->features.allow_high_precision_mv;
    const int force_integer_mv = cm->features.cur_frame_force_integer_mv;
    if (ref_frame < REF_FRAMES) {
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[ref_frame],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1].as_int = 0;
      if (global_mvs != NULL) global_mvs[ref_frame] = gm_mv[0];
    } else {
      MV_REFERENCE_FRAME rf[2];
      av1_set_ref_frame(rf, ref_frame);
      gm_mv[0] = gm_get_motion_vector(&cm->global_motion[rf[0]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
      gm_mv[1] = gm_get_motion_vector(&cm->global_motion[rf[1]],
                                      allow_high_precision_mv, bsize, mi_col,
                                      mi_row, force_integer_mv);
    }
  }

  setup_ref_mv_list(cm, xd, ref_frame, &ref_mv_count[ref_frame],
                    ref_mv_stack[ref_frame], ref_mv_weight[ref_frame],
                    mv_ref_list ? mv_ref_list[ref_frame] : NULL, gm_mv, mi_row,
                    mi_col, mode_context);
}